

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Address.h
# Opt level: O0

string * __thiscall hwnet::Addr::ToStr_abi_cxx11_(string *__return_storage_ptr__,Addr *this)

{
  char *pcVar1;
  allocator<char> local_6e;
  allocator<char> local_6d [18];
  allocator<char> local_5b;
  ushort local_5a;
  char local_58 [6];
  uint16_t port;
  char ret [32];
  char ip [32];
  Addr *this_local;
  
  if (this->addrType == 1) {
    memset(ret + 0x18,0,0x20);
    memset(local_58,0,0x20);
    local_5a = ntohs((this->sockaddr).in.sin_port);
    pcVar1 = inet_ntop(this->family,(void *)((long)&this->sockaddr + 4),ret + 0x18,0x20);
    if (pcVar1 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_5b);
      std::allocator<char>::~allocator(&local_5b);
    }
    else {
      snprintf(local_58,0x20,"%s:%d",ret + 0x18,(ulong)local_5a);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,local_58,local_6d);
      std::allocator<char>::~allocator(local_6d);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_6e);
    std::allocator<char>::~allocator(&local_6e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToStr() const {
        if(this->addrType == SOCK_ADDR_IPV4) {
            char ip[32] = {0};
            char ret[32] = {0};
            auto port = ntohs(this->sockaddr.in.sin_port);
            if(NULL == ::inet_ntop(this->family,(const char*)&this->sockaddr.in.sin_addr,ip,sizeof(ip))){
                return std::string("");
            } else {
                snprintf(ret,32,"%s:%d",ip,port);
                return std::string(ret);
            }
        }
        return std::string("");
    }